

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipm.cc
# Opt level: O3

void __thiscall ipx::IPM::ComputeStartingPoint(IPM *this)

{
  Vector *x_00;
  ulong __n;
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  IPM *pIVar5;
  Model *pMVar6;
  double *__p;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  ulong uVar10;
  double *pdVar11;
  double *pdVar12;
  ulong uVar13;
  long lVar14;
  double *__p_2;
  size_t sVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  Vector zl;
  Vector rb;
  Vector xl;
  Vector y;
  Vector zu;
  Vector xu;
  Vector x;
  int local_c8;
  Vector local_c0;
  Vector local_b0;
  double *local_a0;
  Vector local_98;
  Vector local_88;
  double local_78;
  Vector local_70;
  Vector local_60;
  Vector local_50;
  IPM *local_40;
  Model *local_38;
  
  local_38 = this->iterate_->model_;
  sVar15 = (size_t)local_38->num_rows_;
  uVar10 = (long)local_38->num_cols_ + sVar15;
  uVar13 = uVar10 * 8;
  local_50._M_size = uVar10;
  pdVar7 = (double *)operator_new(uVar13);
  local_50._M_data = pdVar7;
  memset(pdVar7,0,uVar13);
  local_98._M_size = uVar10;
  local_98._M_data = (double *)operator_new(uVar13);
  local_40 = this;
  memset(local_98._M_data,0,uVar13);
  local_60._M_size = uVar10;
  pdVar8 = (double *)operator_new(uVar13);
  local_60._M_data = pdVar8;
  memset(pdVar8,0,uVar13);
  __n = sVar15 * 8;
  local_88._M_size = sVar15;
  local_88._M_data = (double *)operator_new(__n);
  memset(local_88._M_data,0,__n);
  local_c0._M_size = uVar10;
  local_c0._M_data = (double *)operator_new(uVar13);
  memset(local_c0._M_data,0,uVar13);
  local_70._M_size = uVar10;
  local_a0 = (double *)operator_new(uVar13);
  local_70._M_data = local_a0;
  memset(local_a0,0,uVar13);
  local_b0._M_size = sVar15;
  local_b0._M_data = (double *)operator_new(__n);
  memset(local_b0._M_data,0,__n);
  pIVar5 = local_40;
  KKTSolver::Factorize(local_40->kkt_,(Iterate *)0x0,local_40->info_);
  pMVar6 = local_38;
  if ((pIVar5->info_->super_ipx_info).errflag != 0) goto LAB_0039ac23;
  sVar15 = (local_38->b_)._M_size;
  if (local_b0._M_size == sVar15) {
    if (local_b0._M_size != 0) {
      pdVar11 = (local_38->b_)._M_data;
LAB_0039a51a:
      memcpy(local_b0._M_data,pdVar11,local_b0._M_size << 3);
    }
  }
  else {
    if (local_b0._M_data != (double *)0x0) {
      operator_delete(local_b0._M_data);
      sVar15 = (pMVar6->b_)._M_size;
    }
    local_b0._M_size = sVar15;
    local_b0._M_data = (double *)operator_new(sVar15 << 3);
    pdVar11 = (pMVar6->b_)._M_data;
    if (pdVar11 != (double *)0x0) goto LAB_0039a51a;
  }
  local_c8 = (int)uVar10;
  if (0 < local_c8) {
    pdVar11 = (pMVar6->lb_)._M_data;
    pdVar9 = (pMVar6->ub_)._M_data;
    uVar13 = 0;
    do {
      dVar18 = pdVar11[uVar13];
      if (dVar18 <= 0.0) {
        dVar18 = 0.0;
      }
      dVar17 = pdVar9[uVar13];
      if (dVar18 <= dVar17) {
        dVar17 = dVar18;
      }
      pdVar7[uVar13] = dVar17;
      if ((dVar17 != 0.0) || (NAN(dVar17))) {
        piVar3 = (pMVar6->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = piVar3[uVar13];
        lVar14 = (long)iVar1;
        iVar2 = piVar3[uVar13 + 1];
        if (iVar1 < iVar2) {
          piVar3 = (pMVar6->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar4 = (pMVar6->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          do {
            iVar1 = piVar3[lVar14];
            local_b0._M_data[iVar1] = pdVar4[lVar14] * -dVar17 + local_b0._M_data[iVar1];
            lVar14 = lVar14 + 1;
          } while (iVar2 != lVar14);
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uVar10 & 0xffffffff));
  }
  dVar18 = Infnorm(&local_b0);
  pdVar11 = local_a0;
  if (local_c0._M_size != 0) {
    local_78 = dVar18;
    memset(local_c0._M_data,0,local_c0._M_size << 3);
    dVar18 = local_78;
  }
  KKTSolver::Solve(pIVar5->kkt_,&local_c0,&local_b0,dVar18 * 0.1,&local_98,&local_88,pIVar5->info_);
  if ((pIVar5->info_->super_ipx_info).errflag != 0) goto LAB_0039ac23;
  dVar18 = 0.0;
  if (0 < local_c8) {
    pdVar9 = local_98._M_data;
    pdVar12 = pdVar7;
    do {
      *pdVar12 = *pdVar9 + *pdVar12;
      pdVar12 = pdVar12 + 1;
      pdVar9 = pdVar9 + 1;
    } while (pdVar9 < local_98._M_data + uVar10);
    if (0 < local_c8) {
      pdVar9 = (pMVar6->lb_)._M_data;
      pdVar12 = (pMVar6->ub_)._M_data;
      dVar18 = 0.0;
      uVar13 = 0;
      do {
        dVar17 = pdVar7[uVar13] - pdVar9[uVar13];
        local_98._M_data[uVar13] = dVar17;
        dVar17 = -dVar17;
        if (dVar17 <= dVar18) {
          dVar17 = dVar18;
        }
        dVar18 = pdVar12[uVar13] - pdVar7[uVar13];
        pdVar8[uVar13] = dVar18;
        dVar18 = -dVar18;
        if (dVar18 <= dVar17) {
          dVar18 = dVar17;
        }
        uVar13 = uVar13 + 1;
      } while ((uVar10 & 0xffffffff) != uVar13);
    }
  }
  dVar18 = dVar18 * 1.5 + 1.0;
  if (0 < (long)local_98._M_size) {
    pdVar7 = local_98._M_data;
    do {
      *pdVar7 = *pdVar7 + dVar18;
      pdVar7 = pdVar7 + 1;
    } while (pdVar7 < local_98._M_data + local_98._M_size);
  }
  x_00 = &pMVar6->c_;
  pdVar7 = pdVar8 + uVar10;
  pdVar9 = pdVar8;
  if (0 < local_c8) {
    do {
      *pdVar9 = *pdVar9 + dVar18;
      pdVar9 = pdVar9 + 1;
    } while (pdVar9 < pdVar7);
  }
  dVar18 = Twonorm(x_00);
  if ((dVar18 != 0.0) || (NAN(dVar18))) {
    local_78 = dVar18;
    if (local_b0._M_size != 0) {
      memset(local_b0._M_data,0,local_b0._M_size << 3);
    }
    dVar18 = Infnorm(x_00);
    KKTSolver::Solve(pIVar5->kkt_,x_00,&local_b0,dVar18 * 0.1,&local_c0,&local_88,pIVar5->info_);
    if ((pIVar5->info_->super_ipx_info).errflag != 0) goto LAB_0039ac23;
    std::valarray<double>::operator=(&local_c0,x_00);
    MultiplyAdd(&pMVar6->AI_,&local_88,-1.0,&local_c0,'T');
    dVar18 = Twonorm(&local_c0);
    if (dVar18 < local_78 * 0.05) {
      if (local_c0._M_size != 0) {
        pdVar9 = (pMVar6->c_)._M_data;
        uVar13 = 0;
        do {
          local_c0._M_data[uVar13] = pdVar9[uVar13] * 0.05 + local_c0._M_data[uVar13];
          uVar13 = uVar13 + 1;
        } while (local_c0._M_size != uVar13);
      }
      if (0 < (long)local_88._M_size) {
        pdVar9 = local_88._M_data;
        do {
          *pdVar9 = *pdVar9 * 0.95;
          pdVar9 = pdVar9 + 1;
        } while (pdVar9 < local_88._M_data + local_88._M_size);
      }
    }
    if (0 < local_c8) {
      pdVar9 = (pMVar6->lb_)._M_data;
      pdVar12 = (pMVar6->ub_)._M_data;
      dVar18 = 0.0;
      uVar13 = 0;
      do {
        dVar17 = local_c0._M_data[uVar13];
        local_c0._M_data[uVar13] = 0.0;
        pdVar11[uVar13] = 0.0;
        dVar16 = ABS(pdVar12[uVar13]);
        if ((ulong)ABS(pdVar9[uVar13]) < 0x7ff0000000000000) {
          if ((ulong)dVar16 < 0x7ff0000000000000) {
            local_c0._M_data[uVar13] = dVar17 * 0.5;
            dVar19 = dVar17 * -0.5;
            local_a0[uVar13] = dVar19;
          }
          else {
            local_c0._M_data[uVar13] = dVar17;
            dVar19 = local_a0[uVar13];
          }
        }
        else {
          dVar19 = 0.0;
          if ((ulong)dVar16 < 0x7ff0000000000000) {
            dVar19 = -dVar17;
            local_a0[uVar13] = dVar19;
          }
        }
        dVar17 = -local_c0._M_data[uVar13];
        if (-local_c0._M_data[uVar13] <= dVar18) {
          dVar17 = dVar18;
        }
        dVar18 = -dVar19;
        if (-dVar19 <= dVar17) {
          dVar18 = dVar17;
        }
        uVar13 = uVar13 + 1;
        pdVar11 = local_a0;
      } while ((uVar10 & 0xffffffff) != uVar13);
      if (0 < local_c8) {
        dVar18 = dVar18 * 1.5 + 1.0;
        pdVar9 = (pMVar6->lb_)._M_data;
        pdVar12 = (pMVar6->ub_)._M_data;
        uVar13 = 0;
        do {
          if ((ulong)ABS(pdVar9[uVar13]) < 0x7ff0000000000000) {
            local_c0._M_data[uVar13] = local_c0._M_data[uVar13] + dVar18;
          }
          if ((ulong)ABS(pdVar12[uVar13]) < 0x7ff0000000000000) {
            local_a0[uVar13] = local_a0[uVar13] + dVar18;
          }
          uVar13 = uVar13 + 1;
        } while ((uVar10 & 0xffffffff) != uVar13);
        goto LAB_0039a7b2;
      }
    }
LAB_0039aaf5:
    dVar18 = 1.0;
    dVar17 = 1.0;
    dVar16 = 0.5;
  }
  else {
    if (local_c8 < 1) goto LAB_0039aaf5;
    pdVar9 = (pMVar6->lb_)._M_data;
    pdVar12 = (pMVar6->ub_)._M_data;
    uVar13 = 0;
    do {
      dVar18 = 1.0;
      if (0x7fefffffffffffff < (ulong)ABS(pdVar9[uVar13])) {
        dVar18 = 0.0;
      }
      local_c0._M_data[uVar13] = dVar18;
      dVar18 = 1.0;
      if (0x7fefffffffffffff < (ulong)ABS(pdVar12[uVar13])) {
        dVar18 = 0.0;
      }
      pdVar11[uVar13] = dVar18;
      uVar13 = uVar13 + 1;
    } while ((uVar10 & 0xffffffff) != uVar13);
LAB_0039a7b2:
    if (local_c8 < 1) {
      dVar18 = 1.0;
      dVar17 = 1.0;
      dVar16 = 0.5;
    }
    else {
      dVar18 = 1.0;
      dVar17 = 1.0;
      dVar16 = 1.0;
      uVar13 = 0;
      do {
        if ((ulong)ABS((pMVar6->lb_)._M_data[uVar13]) < 0x7ff0000000000000) {
          dVar18 = dVar18 + local_98._M_data[uVar13];
          dVar17 = dVar17 + local_c0._M_data[uVar13];
          dVar16 = dVar16 + local_98._M_data[uVar13] * local_c0._M_data[uVar13];
        }
        if ((ulong)ABS((pMVar6->ub_)._M_data[uVar13]) < 0x7ff0000000000000) {
          dVar18 = dVar18 + pdVar8[uVar13];
          dVar17 = dVar17 + pdVar11[uVar13];
          dVar16 = dVar16 + pdVar8[uVar13] * pdVar11[uVar13];
        }
        uVar13 = uVar13 + 1;
      } while ((uVar10 & 0xffffffff) != uVar13);
      dVar16 = dVar16 * 0.5;
    }
  }
  if (0 < (long)local_98._M_size) {
    pdVar9 = local_98._M_data;
    do {
      *pdVar9 = *pdVar9 + dVar16 / dVar17;
      pdVar9 = pdVar9 + 1;
    } while (pdVar9 < local_98._M_data + local_98._M_size);
  }
  if (0 < local_c8) {
    do {
      *pdVar8 = *pdVar8 + dVar16 / dVar17;
      pdVar8 = pdVar8 + 1;
    } while (pdVar8 < pdVar7);
    if (0 < local_c8) {
      pdVar7 = (pMVar6->lb_)._M_data;
      pdVar8 = (pMVar6->ub_)._M_data;
      uVar13 = 0;
      do {
        if ((ulong)ABS(pdVar7[uVar13]) < 0x7ff0000000000000) {
          local_c0._M_data[uVar13] = local_c0._M_data[uVar13] + dVar16 / dVar18;
        }
        if ((ulong)ABS(pdVar8[uVar13]) < 0x7ff0000000000000) {
          pdVar11[uVar13] = pdVar11[uVar13] + dVar16 / dVar18;
        }
        uVar13 = uVar13 + 1;
      } while ((uVar10 & 0xffffffff) != uVar13);
    }
  }
  Iterate::Initialize(pIVar5->iterate_,&local_50,&local_98,&local_60,&local_88,&local_c0,&local_70);
  dVar18 = Iterate::complementarity(pIVar5->iterate_);
  pIVar5->best_complementarity_ = dVar18;
LAB_0039ac23:
  operator_delete(local_b0._M_data);
  operator_delete(local_70._M_data);
  operator_delete(local_c0._M_data);
  operator_delete(local_88._M_data);
  operator_delete(local_60._M_data);
  operator_delete(local_98._M_data);
  operator_delete(local_50._M_data);
  return;
}

Assistant:

void IPM::ComputeStartingPoint() {
    const Model& model = iterate_->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const SparseMatrix& AI = model.AI();
    const Vector& b = model.b();
    const Vector& c = model.c();
    const Vector& lb = model.lb();
    const Vector& ub = model.ub();
    Vector x(n+m), xl(n+m), xu(n+m), y(m), zl(n+m), zu(n+m);
    Vector rb(m);               // workspace

    // Factorize the KKT matrix with the identity matrix in the (1,1) block.
    kkt_->Factorize(nullptr, info_);
    if (info_->errflag)
        return;

    // Set x within its bounds and compute the minimum norm solution dx to
    // AI*dx = (b-AI*x). Then update x := x + dx to obtain a feasible point.
    rb = b;
    for (Int j = 0; j < n+m; j++) {
        double xj = 0.0;
        if (xj < lb[j])
            xj = lb[j];
        if (xj > ub[j])
            xj = ub[j];
        x[j] = xj;
        if (xj != 0.0)
            ScatterColumn(AI, j, -xj, rb);
    }
    double tol = 0.1 * Infnorm(rb);
    zl = 0.0;
    kkt_->Solve(zl, rb, tol, xl, y, info_);
    if (info_->errflag)
        return;
    x += xl;

    // Compute xl, xu and shift to become positive.
    double xinfeas = 0.0;
    for (Int j = 0; j < n+m; j++) {
        xl[j] = x[j]-lb[j];
        xinfeas = std::max(xinfeas, -xl[j]);
        xu[j] = ub[j]-x[j];
        xinfeas = std::max(xinfeas, -xu[j]);
    }
    double xshift1 = 1.0 + 1.5*xinfeas;
    xl += xshift1;
    xu += xshift1;

    const double cnorm = Twonorm(c);
    if (cnorm == 0.0) {
        // Special treatment for zero objective.
        for (Int j = 0; j < n+m; j++) {
            zl[j] = std::isfinite(lb[j]) ? 1.0 : 0.0;
            zu[j] = std::isfinite(ub[j]) ? 1.0 : 0.0;
        }
    } else {
        // Compute y as the least-squares solution to AI'*y=c.
        // Recompute zl = c-AI'*y because the KKT system is solved
        // approximately with a residual in the first block equation.
        rb = 0.0;
        double tol = 0.1 * Infnorm(c);
        kkt_->Solve(c, rb, tol, zl, y, info_);
        if (info_->errflag)
            return;
        zl = c;
        MultiplyAdd(AI, y, -1.0, zl, 'T');

        // When c lies in range(AI'), then the dual slack variables are (close
        // to) zero, and the initial point would be almost complementary but
        // usually not primal feasible. To prevent this from happening, add
        // a fraction of the objective to zl and adjust y. In exact computation
        // this does not affect dual feasibility.
        const double znorm = Twonorm(zl);
        const double rho = 0.05;
        if (znorm < rho*cnorm) {
            zl += rho * c;
            y *= (1.0-rho);
        }

        // Split dual slack solution into zl, zu and shift to become positive.
        double zinfeas = 0.0;
        for (Int j = 0; j < n+m; j++) {
            double zval = zl[j];
            zl[j] = 0.0;
            zu[j] = 0.0;
            if (std::isfinite(lb[j]) && std::isfinite(ub[j])) {
                zl[j] = 0.5*zval;
                zu[j] = -0.5*zval;
            }
            else if (std::isfinite(lb[j]))
                zl[j] = zval;
            else if (std::isfinite(ub[j]))
                zu[j] = -zval;
            zinfeas = std::max(zinfeas, -zl[j]);
            zinfeas = std::max(zinfeas, -zu[j]);
        }
        double zshift1 = 1.0 + 1.5*zinfeas;
        for (Int j = 0; j < n+m; j++) {
            if (std::isfinite(lb[j]))
                zl[j] += zshift1;
            if (std::isfinite(ub[j]))
                zu[j] += zshift1;
        }
    }

    // Level pairwise complementarity products.
    double xsum = 1.0;
    double zsum = 1.0;
    double mu = 1.0;
    for (Int j = 0; j < n+m; j++) {
        if (std::isfinite(lb[j])) {
            xsum += xl[j];
            zsum += zl[j];
            mu += xl[j]*zl[j];
        }
        if (std::isfinite(ub[j])) {
            xsum += xu[j];
            zsum += zu[j];
            mu += xu[j]*zu[j];
        }
    }
    double xshift2 = 0.5*mu/zsum;
    double zshift2 = 0.5*mu/xsum;
    xl += xshift2;
    xu += xshift2;
    for (Int j = 0; j < n+m; j++) {
        if (std::isfinite(lb[j]))
            zl[j] += zshift2;
        if (std::isfinite(ub[j]))
            zu[j] += zshift2;
    }
    iterate_->Initialize(x, xl, xu, y, zl, zu);
    best_complementarity_ = iterate_->complementarity();
}